

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

bool amrex::ParmParse::QueryUnusedInputs(void)

{
  bool bVar1;
  ostream *poVar2;
  string local_60;
  string local_40;
  
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    bVar1 = unused_table_entries_q((Table *)&(anonymous_namespace)::g_table_abi_cxx11_,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1 != false) {
    finalize_verbose = system::verbose != 0;
    if ((bool)finalize_verbose) {
      poVar2 = OutStream();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"Unused ParmParse Variables:\n",0x1c);
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"  [TOP]","");
    finalize_table(&local_60,(Table *)&(anonymous_namespace)::g_table_abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (finalize_verbose == '\x01') {
      poVar2 = OutStream();
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  return bVar1;
}

Assistant:

ParmParse::Frame::Frame (ParmParse& pp, const std::string& pfix)
    :
    m_pp(pp), m_np(0)
{
    push(pfix);
    BL_ASSERT( m_np == 1 );
}